

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O1

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (n < 1) {
    uVar6 = 1;
  }
  else {
    uVar6 = (ulong)(n + 1);
    puVar2 = &(*huffmanTree)[1].parent;
    uVar7 = 1;
    do {
      if (*puVar2 == 0) {
        uVar6 = uVar7 & 0xffffffff;
        break;
      }
      uVar7 = uVar7 + 1;
      puVar2 = puVar2 + 4;
    } while (uVar6 != uVar7);
  }
  if (0 < n) {
    puVar2 = &(*huffmanTree)[1].parent;
    uVar7 = 1;
    do {
      if (*puVar2 == 0) {
        uVar5 = (uint)uVar7;
        if ((*huffmanTree)[(int)(uint)uVar6].weight <=
            ((anon_struct_16_4_a52fbe9e *)(puVar2 + -1))->weight) {
          uVar5 = (uint)uVar6;
        }
        uVar6 = (ulong)uVar5;
      }
      uVar7 = uVar7 + 1;
      puVar2 = puVar2 + 4;
    } while (n + 1 != uVar7);
  }
  *s1 = (int)uVar6;
  uVar7 = uVar6;
  if (0 < n) {
    puVar2 = &(*huffmanTree)[1].parent;
    uVar4 = 1;
    do {
      if ((*puVar2 == 0) && (uVar7 = uVar4, uVar6 != uVar4)) break;
      uVar4 = uVar4 + 1;
      puVar2 = puVar2 + 4;
      uVar7 = uVar6;
    } while (n + 1 != uVar4);
  }
  iVar3 = (int)uVar7;
  if (0 < n) {
    puVar2 = &(*huffmanTree)[1].parent;
    uVar4 = 1;
    do {
      if ((*puVar2 == 0) && (uVar6 != uVar4)) {
        uVar1 = uVar4;
        if ((*huffmanTree)[(int)uVar7].weight <=
            ((anon_struct_16_4_a52fbe9e *)(puVar2 + -1))->weight) {
          uVar1 = uVar7;
        }
        uVar7 = uVar1 & 0xffffffff;
      }
      iVar3 = (int)uVar7;
      uVar4 = uVar4 + 1;
      puVar2 = puVar2 + 4;
    } while (n + 1 != uVar4);
  }
  *s2 = iVar3;
  return;
}

Assistant:

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2){
    //标记i
    int i = 0;
    //记录最小权值
    int min;
    //遍历全部节点，找出单节点
    for(i = 1;i <= n;i++){
        //如果此结点的父亲没有，那麽把结点好赋值给min，跳出循环
        if((*huffmanTree)[i].parent == 0){
            min = i;
            break;
        }
    }
    //继续遍历全部节点，找出权值最小节点
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //找到了最小权值的结点，s1指向
    *s1 = min;
    //遍历全部结点
    for(i = 1;i <= n;i++){
        //找出下一个节点，且没有被s1指向，那麽赋值i给min，跳出循环
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            min = i;
            break;
        }
    }
    //继续遍历全部结点，找到权值最小的那一个
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //s2指针指向第二个权值最小的叶子结点
    *s2 = min;
}